

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

BOOL __thiscall Js::JavascriptArray::BigIndex::DeleteItem(BigIndex *this,JavascriptArray *arr)

{
  BOOL BVar1;
  int iVar2;
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  
  if (this->index != 0xffffffff) {
    BVar1 = IndexTrace<unsigned_int>::DeleteItem(arr,&this->index);
    return BVar1;
  }
  JavascriptOperators::GetPropertyIdForInt
            (this->bigIndex,
             (((((arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,&local_20);
  iVar2 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x21])
                    (arr,(ulong)(uint)local_20->pid,0);
  return iVar2;
}

Assistant:

BOOL JavascriptArray::BigIndex::DeleteItem(JavascriptArray* arr) const
    {
        if (IsSmallIndex())
        {
            return small_index::DeleteItem(arr, index);
        }
        else
        {
            ScriptContext* scriptContext = arr->GetScriptContext();
            PropertyRecord const * propertyRecord;
            JavascriptOperators::GetPropertyIdForInt(bigIndex, scriptContext, &propertyRecord);
            return arr->DeleteProperty(propertyRecord->GetPropertyId(), PropertyOperation_None);
        }
    }